

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::DPIVisitor::visit(DPIVisitor *this,FunctionStmtBlock *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  initializer_list<kratos::IRNode_*> __l_03;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *this_00;
  string *__args;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  PortDirection PVar6;
  PortDirection PVar7;
  mapped_type *ppDVar8;
  size_type sVar9;
  size_type sVar10;
  StmtException *pSVar11;
  element_type *peVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__y;
  bool *pbVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>,_bool>
  pVar14;
  undefined1 auVar15 [16];
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  DPIFunctionStmtBlock *local_490;
  DPIFunctionStmtBlock *local_440;
  allocator<kratos::IRNode_*> local_401;
  IRNode *local_400;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *local_3f8;
  iterator local_3f0;
  size_type local_3e8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_382;
  allocator<const_kratos::IRNode_*> local_381;
  element_type *local_380;
  element_type *local_378;
  element_type **local_370;
  size_type local_368;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_360;
  string local_348;
  __shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *local_328;
  mapped_type *port;
  element_type *local_318;
  element_type **local_310;
  size_type local_308;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_300;
  string local_2e8;
  _Self local_2c8;
  _Self local_2c0;
  __shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *local_2b8;
  type *port_ref;
  type *port_name;
  _Self local_2a0;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *__range3;
  IRNode *local_280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *local_278;
  iterator local_270;
  size_type local_268;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  DPIFunctionStmtBlock *local_208;
  DPIFunctionStmtBlock *dpi_stmt;
  IRNode *local_1f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *local_1f0;
  iterator local_1e8;
  size_type local_1e0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *local_180;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *ports;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  *ref_ports;
  DPIFunctionStmtBlock *ref_stmt;
  undefined1 local_160;
  DPIFunctionStmtBlock *local_158;
  _Self local_150 [3];
  _Self local_138;
  string local_130;
  string *local_110;
  string *func_name;
  FunctionStmtBlock *stmt_local;
  DPIVisitor *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_f0;
  basic_string_view<char> local_e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_b8;
  string *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  func_name = (string *)stmt;
  stmt_local = (FunctionStmtBlock *)this;
  uVar3 = (*(stmt->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])();
  if ((uVar3 & 1) != 0) {
    FunctionStmtBlock::function_name_abi_cxx11_(&local_130,(FunctionStmtBlock *)func_name);
    local_110 = &local_130;
    local_138._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
         ::find(&this->dpi_funcs_,&local_130);
    local_150[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
         ::end(&this->dpi_funcs_);
    bVar1 = std::operator==(&local_138,local_150);
    __args = local_110;
    if (bVar1) {
      if (func_name == (string *)0x0) {
        local_440 = (DPIFunctionStmtBlock *)0x0;
      }
      else {
        local_440 = (DPIFunctionStmtBlock *)
                    __dynamic_cast(func_name,&FunctionStmtBlock::typeinfo,
                                   &DPIFunctionStmtBlock::typeinfo,0);
      }
      local_158 = local_440;
      pVar14 = std::
               map<std::__cxx11::string,kratos::DPIFunctionStmtBlock*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>>
               ::emplace<std::__cxx11::string_const&,kratos::DPIFunctionStmtBlock*>
                         ((map<std::__cxx11::string,kratos::DPIFunctionStmtBlock*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::DPIFunctionStmtBlock*>>>
                           *)&this->dpi_funcs_,__args,&local_158);
      ref_stmt = (DPIFunctionStmtBlock *)pVar14.first._M_node;
      local_160 = pVar14.second;
    }
    else {
      ppDVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::DPIFunctionStmtBlock_*>_>_>
                ::at(&this->dpi_funcs_,local_110);
      ref_ports = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                   *)*ppDVar8;
      ports = FunctionStmtBlock::ports_abi_cxx11_((FunctionStmtBlock *)ref_ports);
      local_180 = FunctionStmtBlock::ports_abi_cxx11_((FunctionStmtBlock *)func_name);
      sVar9 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              ::size(ports);
      sVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
               ::size(local_180);
      if (sVar9 != sVar10) {
        dpi_stmt._6_1_ = 1;
        pSVar11 = (StmtException *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1c0,"DPI function ",local_110);
        std::operator+(&local_1a0,&local_1c0," has different interface");
        local_1f8 = (IRNode *)func_name;
        local_1f0 = ref_ports;
        local_1e8 = &local_1f8;
        local_1e0 = 2;
        std::allocator<kratos::IRNode_*>::allocator
                  ((allocator<kratos::IRNode_*> *)((long)&dpi_stmt + 7));
        __l_03._M_len = local_1e0;
        __l_03._M_array = local_1e8;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_1d8,__l_03,(allocator<kratos::IRNode_*> *)((long)&dpi_stmt + 7));
        StmtException::StmtException(pSVar11,&local_1a0,&local_1d8);
        dpi_stmt._6_1_ = 0;
        __cxa_throw(pSVar11,&StmtException::typeinfo,StmtException::~StmtException);
      }
      if (func_name == (string *)0x0) {
        local_490 = (DPIFunctionStmtBlock *)0x0;
      }
      else {
        local_490 = (DPIFunctionStmtBlock *)
                    __dynamic_cast(func_name,&FunctionStmtBlock::typeinfo,
                                   &DPIFunctionStmtBlock::typeinfo,0);
      }
      local_208 = local_490;
      uVar4 = DPIFunctionStmtBlock::return_width(local_490);
      uVar5 = DPIFunctionStmtBlock::return_width((DPIFunctionStmtBlock *)ref_ports);
      if (uVar4 != uVar5) {
        sVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                ::size(ports);
        sVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                 ::size(local_180);
        if (sVar9 != sVar10) {
          __range3._6_1_ = 1;
          pSVar11 = (StmtException *)__cxa_allocate_exception(0x10);
          std::operator+(&local_248,"DPI function ",local_110);
          std::operator+(&local_228,&local_248," has different interface");
          local_280 = (IRNode *)func_name;
          local_278 = ref_ports;
          local_270 = &local_280;
          local_268 = 2;
          std::allocator<kratos::IRNode_*>::allocator
                    ((allocator<kratos::IRNode_*> *)((long)&__range3 + 7));
          __l_02._M_len = local_268;
          __l_02._M_array = local_270;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    (&local_260,__l_02,(allocator<kratos::IRNode_*> *)((long)&__range3 + 7));
          StmtException::StmtException(pSVar11,&local_228,&local_260);
          __range3._6_1_ = 0;
          __cxa_throw(pSVar11,&StmtException::typeinfo,StmtException::~StmtException);
        }
      }
      this_00 = ports;
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
               ::begin(ports);
      local_2a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
           ::end(this_00);
      while (bVar1 = std::operator!=(&__end3,&local_2a0), bVar1) {
        port_name = &std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>
                     ::operator*(&__end3)->first;
        port_ref = (type *)std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::Port>>
                                     ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>
                                       *)port_name);
        local_2b8 = &std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::Port>>
                               ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>
                                 *)port_name)->
                     super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
        local_2c0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
             ::find(local_180,(key_type *)port_ref);
        local_2c8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
             ::end(local_180);
        bVar1 = std::operator==(&local_2c0,&local_2c8);
        if (bVar1) {
          port._6_1_ = 1;
          auVar15 = __cxa_allocate_exception(0x10);
          local_60 = &local_2e8;
          local_68 = "DPI function with the same name ({0}) have different interface";
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_110;
          local_88.named_args.data =
               (named_arg_info<char> *)
               fmt::v7::make_args_checked<std::__cxx11::string_const&,char[63],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"DPI function with the same name ({0}) have different interface",
                          (v7 *)local_110,auVar15._8_8_,
                          (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                          "DPI function with the same name ({0}) have different interface");
          local_78 = &local_88;
          local_98 = fmt::v7::to_string_view<char,_0>(local_68);
          local_50 = &local_a8;
          local_58 = local_78;
          local_20 = local_78;
          local_10 = local_78;
          local_18 = local_50;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_50,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_78->string);
          format_str.size_ = local_a8.desc_;
          format_str.data_ = (char *)local_98.size_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_a8.field_1.values_;
          fmt::v7::detail::vformat_abi_cxx11_(&local_2e8,(detail *)local_98.data_,format_str,args);
          local_318 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get(local_2b8);
          local_310 = &local_318;
          local_308 = 1;
          std::allocator<const_kratos::IRNode_*>::allocator
                    ((allocator<const_kratos::IRNode_*> *)((long)&port + 7));
          __l_01._M_len = local_308;
          __l_01._M_array = (iterator)local_310;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_300,__l_01,(allocator<const_kratos::IRNode_*> *)((long)&port + 7));
          VarException::VarException(auVar15._0_8_,&local_2e8,&local_300);
          port._6_1_ = 0;
          __cxa_throw(auVar15._0_8_,&VarException::typeinfo,VarException::~VarException);
        }
        local_328 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
                     ::at(local_180,(key_type *)port_ref)->
                     super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_328);
        __x = Var::size(&peVar12->super_Var);
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_2b8);
        __y = Var::size(&peVar12->super_Var);
        bVar1 = std::operator!=(__x,__y);
        if (bVar1) {
LAB_003ee1f1:
          local_382 = 1;
          auVar15 = __cxa_allocate_exception(0x10);
          local_b0 = &local_348;
          local_b8 = "DPI function with the same name ({0}) have different interface";
          vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_110;
          local_d8.named_args.data =
               (named_arg_info<char> *)
               fmt::v7::make_args_checked<std::__cxx11::string_const&,char[63],char>
                         ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)"DPI function with the same name ({0}) have different interface",
                          (v7 *)local_110,auVar15._8_8_,
                          (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                          "DPI function with the same name ({0}) have different interface");
          local_c8 = &local_d8;
          local_e8 = fmt::v7::to_string_view<char,_0>(local_b8);
          local_40 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&this_local;
          local_48 = local_c8;
          local_38 = local_c8;
          local_28 = local_c8;
          local_30 = local_40;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_40,0xd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)&local_c8->string);
          format_str_00.size_ = (size_t)this_local;
          format_str_00.data_ = (char *)local_e8.size_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_f0.values_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_348,(detail *)local_e8.data_,format_str_00,args_00);
          local_380 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get(local_2b8);
          local_378 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get(local_328);
          local_370 = &local_380;
          local_368 = 2;
          std::allocator<const_kratos::IRNode_*>::allocator(&local_381);
          __l_00._M_len = local_368;
          __l_00._M_array = (iterator)local_370;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    (&local_360,__l_00,&local_381);
          VarException::VarException(auVar15._0_8_,&local_348,&local_360);
          local_382 = 0;
          __cxa_throw(auVar15._0_8_,&VarException::typeinfo,VarException::~VarException);
        }
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_328);
        pbVar13 = Var::is_signed(&peVar12->super_Var);
        bVar1 = *pbVar13;
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_2b8);
        pbVar13 = Var::is_signed(&peVar12->super_Var);
        if ((bVar1 & 1U) != (*pbVar13 & 1U)) goto LAB_003ee1f1;
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_328);
        PVar6 = Port::port_direction(peVar12);
        peVar12 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_2b8);
        PVar7 = Port::port_direction(peVar12);
        if (PVar6 != PVar7) goto LAB_003ee1f1;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>
        ::operator++(&__end3);
      }
      bVar1 = DPIFunctionStmtBlock::is_context(local_208);
      bVar2 = DPIFunctionStmtBlock::is_context((DPIFunctionStmtBlock *)ref_ports);
      if (bVar1 != bVar2) {
LAB_003ee50a:
        pSVar11 = (StmtException *)__cxa_allocate_exception(0x10);
        std::operator+(&local_3c8,"DPI function ",local_110);
        std::operator+(&local_3a8,&local_3c8," has different attribute (pure/context)");
        local_400 = (IRNode *)func_name;
        local_3f8 = ref_ports;
        local_3f0 = &local_400;
        local_3e8 = 2;
        std::allocator<kratos::IRNode_*>::allocator(&local_401);
        __l._M_len = local_3e8;
        __l._M_array = local_3f0;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_3e0,__l,&local_401);
        StmtException::StmtException(pSVar11,&local_3a8,&local_3e0);
        __cxa_throw(pSVar11,&StmtException::typeinfo,StmtException::~StmtException);
      }
      bVar1 = DPIFunctionStmtBlock::is_pure(local_208);
      bVar2 = DPIFunctionStmtBlock::is_pure((DPIFunctionStmtBlock *)ref_ports);
      if (bVar1 != bVar2) goto LAB_003ee50a;
    }
    std::__cxx11::string::~string((string *)&local_130);
  }
  return;
}

Assistant:

void visit(FunctionStmtBlock* stmt) override {
        if (!stmt->is_dpi()) return;
        // collect all the dpi information and then make sure they are declared in the same
        // name and spec
        // this can be an issue if the files are going to split into multiple files
        auto const& func_name = stmt->function_name();
        if (dpi_funcs_.find(func_name) == dpi_funcs_.end()) {
            // new one
            dpi_funcs_.emplace(func_name, dynamic_cast<DPIFunctionStmtBlock*>(stmt));
        } else {
            auto* ref_stmt = dpi_funcs_.at(func_name);
            auto const& ref_ports = ref_stmt->ports();
            auto const& ports = stmt->ports();
            if (ref_ports.size() != ports.size())
                throw StmtException("DPI function " + func_name + " has different interface",
                                    {stmt, ref_stmt});
            // check the return width
            auto* dpi_stmt = dynamic_cast<DPIFunctionStmtBlock*>(stmt);
            if (dpi_stmt->return_width() != ref_stmt->return_width()) {
                if (ref_ports.size() != ports.size())
                    throw StmtException("DPI function " + func_name + " has different interface",
                                        {stmt, ref_stmt});
            }
            for (auto const& [port_name, port_ref] : ref_ports) {
                if (ports.find(port_name) == ports.end()) {
                    throw VarException(
                        ::format("DPI function with the same name ({0}) have different interface",
                                 func_name),
                        {port_ref.get()});
                }
                auto const& port = ports.at(port_name);
                if (port->size() != port_ref->size() ||
                    port->is_signed() != port_ref->is_signed() ||
                    port->port_direction() != port_ref->port_direction()) {
                    throw VarException(
                        ::format("DPI function with the same name ({0}) have different interface",
                                 func_name),
                        {port_ref.get(), port.get()});
                }
            }
            if (dpi_stmt->is_context() != ref_stmt->is_context() ||
                dpi_stmt->is_pure() != ref_stmt->is_pure())
                throw StmtException(
                    "DPI function " + func_name + " has different attribute (pure/context)",
                    {stmt, ref_stmt});
        }
    }